

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::addWarning(ConfigData *config,string *_warning)

{
  bool bVar1;
  runtime_error *this;
  char local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  string *local_18;
  string *_warning_local;
  ConfigData *config_local;
  
  local_18 = _warning;
  _warning_local = (string *)config;
  bVar1 = std::operator==(_warning,"NoAssertions");
  if (!bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "Unrecognised warning: \'");
    std::operator+(local_38,local_58);
    std::runtime_error::runtime_error(this,(string *)local_38);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(uint *)(_warning_local + 0x18) = *(uint *)(_warning_local + 0x18) | 1;
  return;
}

Assistant:

inline void addWarning( ConfigData& config, std::string const& _warning ) {
        if( _warning == "NoAssertions" )
            config.warnings = static_cast<WarnAbout::What>( config.warnings | WarnAbout::NoAssertions );
        else
            throw std::runtime_error( "Unrecognised warning: '" + _warning + "'" );
    }